

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_test.cc
# Opt level: O3

void __thiscall leveldb::_Test_ReopenAppendableFile::_Run(_Test_ReopenAppendableFile *this)

{
  Env *pEVar1;
  WritableFile *appendable_file;
  string test_file_name;
  string data;
  string test_dir;
  Status local_270;
  long *local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  string local_240;
  string local_220;
  void *local_200;
  void *local_1f8;
  undefined1 *local_1f0;
  long local_1e8;
  undefined1 local_1e0 [16];
  Tester local_1d0;
  
  local_1e8 = 0;
  local_1e0[0] = 0;
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/env_test.cc";
  local_1d0.line_ = 0xc9;
  local_1f0 = local_1e0;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
  pEVar1 = (this->super_EnvTest).env_;
  (*pEVar1->_vptr_Env[0x11])(&local_240,pEVar1,&local_1f0);
  test::Tester::IsOk(&local_1d0,(Status *)&local_240);
  if (local_240._M_dataplus._M_p != (pointer)0x0) {
    operator_delete__(local_240._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_240,local_1f0,local_1f0 + local_1e8);
  std::__cxx11::string::append((char *)&local_240);
  pEVar1 = (this->super_EnvTest).env_;
  (*pEVar1->_vptr_Env[8])(&local_1f8,pEVar1,&local_240);
  if (local_1f8 != (void *)0x0) {
    operator_delete__(local_1f8);
  }
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/env_test.cc";
  local_1d0.line_ = 0xce;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
  pEVar1 = (this->super_EnvTest).env_;
  (*pEVar1->_vptr_Env[5])(&local_220,pEVar1,&local_240,&local_268);
  test::Tester::IsOk(&local_1d0,(Status *)&local_220);
  if (local_220._M_dataplus._M_p != (pointer)0x0) {
    operator_delete__(local_220._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"hello world!","");
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/env_test.cc";
  local_1d0.line_ = 0xd0;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
  local_260._M_dataplus._M_p = local_220._M_dataplus._M_p;
  local_260._M_string_length._0_4_ = (undefined4)local_220._M_string_length;
  local_260._M_string_length._4_4_ = local_220._M_string_length._4_4_;
  (**(code **)(*local_268 + 0x10))(&local_270);
  test::Tester::IsOk(&local_1d0,&local_270);
  if (local_270.state_ != (char *)0x0) {
    operator_delete__(local_270.state_);
  }
  test::Tester::~Tester(&local_1d0);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/env_test.cc";
  local_1d0.line_ = 0xd1;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
  (**(code **)(*local_268 + 0x18))(&local_260);
  test::Tester::IsOk(&local_1d0,(Status *)&local_260);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete__(local_260._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  if (local_268 != (long *)0x0) {
    (**(code **)(*local_268 + 8))();
  }
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/env_test.cc";
  local_1d0.line_ = 0xd4;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
  pEVar1 = (this->super_EnvTest).env_;
  (*pEVar1->_vptr_Env[5])(&local_260,pEVar1,&local_240,&local_268);
  test::Tester::IsOk(&local_1d0,(Status *)&local_260);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete__(local_260._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  std::__cxx11::string::_M_replace
            ((ulong)&local_220,0,
             (char *)CONCAT44(local_220._M_string_length._4_4_,
                              (undefined4)local_220._M_string_length),0x10b2d4);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/env_test.cc";
  local_1d0.line_ = 0xd6;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
  local_260._M_dataplus._M_p = local_220._M_dataplus._M_p;
  local_260._M_string_length._0_4_ = (undefined4)local_220._M_string_length;
  local_260._M_string_length._4_4_ = local_220._M_string_length._4_4_;
  (**(code **)(*local_268 + 0x10))(&local_270);
  test::Tester::IsOk(&local_1d0,&local_270);
  if (local_270.state_ != (char *)0x0) {
    operator_delete__(local_270.state_);
  }
  test::Tester::~Tester(&local_1d0);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/env_test.cc";
  local_1d0.line_ = 0xd7;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
  (**(code **)(*local_268 + 0x18))(&local_260);
  test::Tester::IsOk(&local_1d0,(Status *)&local_260);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete__(local_260._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  if (local_268 != (long *)0x0) {
    (**(code **)(*local_268 + 8))();
  }
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/env_test.cc";
  local_1d0.line_ = 0xda;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
  ReadFileToString((leveldb *)&local_260,(this->super_EnvTest).env_,&local_240,&local_220);
  test::Tester::IsOk(&local_1d0,(Status *)&local_260);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete__(local_260._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  local_1d0.ok_ = true;
  local_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/env_test.cc";
  local_1d0.line_ = 0xdb;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"hello world!42","");
  test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>(&local_1d0,&local_260,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1d0);
  pEVar1 = (this->super_EnvTest).env_;
  (*pEVar1->_vptr_Env[8])(&local_200,pEVar1,&local_240);
  if (local_200 != (void *)0x0) {
    operator_delete__(local_200);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p);
  }
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0);
  }
  return;
}

Assistant:

TEST(EnvTest, ReopenAppendableFile) {
  std::string test_dir;
  ASSERT_OK(env_->GetTestDirectory(&test_dir));
  std::string test_file_name = test_dir + "/reopen_appendable_file.txt";
  env_->DeleteFile(test_file_name);

  WritableFile* appendable_file;
  ASSERT_OK(env_->NewAppendableFile(test_file_name, &appendable_file));
  std::string data("hello world!");
  ASSERT_OK(appendable_file->Append(data));
  ASSERT_OK(appendable_file->Close());
  delete appendable_file;

  ASSERT_OK(env_->NewAppendableFile(test_file_name, &appendable_file));
  data = "42";
  ASSERT_OK(appendable_file->Append(data));
  ASSERT_OK(appendable_file->Close());
  delete appendable_file;

  ASSERT_OK(ReadFileToString(env_, test_file_name, &data));
  ASSERT_EQ(std::string("hello world!42"), data);
  env_->DeleteFile(test_file_name);
}